

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aomstats.c
# Opt level: O1

void stats_close(stats_io_t *stats,int last_pass)

{
  if (stats->file == (FILE *)0x0) {
    if (stats->pass == last_pass) {
      free((stats->buf).buf);
      return;
    }
  }
  else {
    if (stats->pass == last_pass) {
      free((stats->buf).buf);
    }
    fclose((FILE *)stats->file);
    stats->file = (FILE *)0x0;
  }
  return;
}

Assistant:

void stats_close(stats_io_t *stats, int last_pass) {
  if (stats->file) {
    if (stats->pass == last_pass) {
      free(stats->buf.buf);
    }

    fclose(stats->file);
    stats->file = NULL;
  } else {
    if (stats->pass == last_pass) free(stats->buf.buf);
  }
}